

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  secp256k1_ge *psVar4;
  secp256k1_ge *a;
  secp256k1_gej *a_00;
  secp256k1_gej *psVar5;
  secp256k1_gej *psVar6;
  ulong uVar7;
  secp256k1_fe *r;
  secp256k1_gej sStack_138;
  secp256k1_fe *psStack_a0;
  secp256k1_fe *psStack_98;
  secp256k1_fe *psStack_90;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  uint64_t uStack_70;
  uint64_t local_68;
  int local_60;
  int local_5c;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  int local_30;
  int local_2c;
  
  a = (secp256k1_ge *)&stack0xffffffffffffff78;
  psVar5 = (secp256k1_gej *)&stack0xffffffffffffff78;
  psVar6 = (secp256k1_gej *)&stack0xffffffffffffff78;
  r = (secp256k1_fe *)0xfffffffffffff;
  psStack_90 = (secp256k1_fe *)0x120419;
  secp256k1_fe_verify(xd);
  uVar2 = (xd->n[4] >> 0x30) * 0x1000003d1 + xd->n[0];
  if (((uVar2 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar2 & 0xfffffffffffff) == 0)) {
    uVar3 = (uVar2 >> 0x34) + xd->n[1];
    psVar4 = (secp256k1_ge *)((uVar3 >> 0x34) + xd->n[2]);
    a_00 = (secp256k1_gej *)(((ulong)psVar4 >> 0x34) + xd->n[3]);
    uVar7 = ((ulong)a_00 >> 0x34) + (xd->n[4] & 0xffffffffffff);
    if ((((uVar3 | uVar2 | (ulong)psVar4 | (ulong)a_00) & 0xfffffffffffff) != 0 || uVar7 != 0) &&
       (((uVar2 | 0x1000003d0) & uVar3 & (ulong)psVar4 & (ulong)a_00 & (uVar7 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001204bf;
    psStack_90 = (secp256k1_fe *)0x1205c6;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
    a = psVar4;
  }
  else {
LAB_001204bf:
    r = (secp256k1_fe *)&stack0xffffffffffffffa8;
    psStack_90 = (secp256k1_fe *)0x1204d2;
    secp256k1_fe_mul(r,xd,xn);
    psStack_90 = (secp256k1_fe *)0x1204e0;
    secp256k1_fe_sqr((secp256k1_fe *)&stack0xffffffffffffff78,xn);
    psStack_90 = (secp256k1_fe *)0x1204ee;
    secp256k1_fe_mul(r,r,(secp256k1_fe *)&stack0xffffffffffffff78);
    psStack_90 = (secp256k1_fe *)0x1204f9;
    secp256k1_fe_sqr((secp256k1_fe *)&stack0xffffffffffffff78,xd);
    psStack_90 = (secp256k1_fe *)0x120504;
    secp256k1_fe_sqr((secp256k1_fe *)&stack0xffffffffffffff78,
                     (secp256k1_fe *)&stack0xffffffffffffff78);
    psStack_90 = (secp256k1_fe *)0x12050c;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff78);
    a_00 = psVar5;
    if (local_60 < 0x11) {
      local_88 = local_88 * 2;
      uStack_80 = uStack_80 * 2;
      local_78 = local_78 * 2;
      uStack_70 = uStack_70 * 2;
      local_68 = local_68 << 1;
      local_60 = local_60 * 2;
      local_5c = 0;
      psStack_90 = (secp256k1_fe *)0x12054f;
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff78);
      xn = (secp256k1_fe *)&stack0xffffffffffffffa8;
      psStack_90 = (secp256k1_fe *)0x12055c;
      secp256k1_fe_verify(xn);
      psStack_90 = (secp256k1_fe *)0x120564;
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff78);
      local_30 = local_60 + local_30;
      xd = (secp256k1_fe *)&stack0xffffffffffffff78;
      a_00 = psVar6;
      if (local_30 < 0x21) {
        local_58 = local_58 + local_88;
        uStack_50 = uStack_50 + uStack_80;
        local_48 = local_48 + local_78;
        uStack_40 = uStack_40 + uStack_70;
        local_38 = local_38 + local_68;
        local_2c = 0;
        psStack_90 = (secp256k1_fe *)0x1205ad;
        secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa8);
        psStack_90 = (secp256k1_fe *)0x1205b5;
        iVar1 = secp256k1_fe_is_square_var((secp256k1_fe *)&stack0xffffffffffffffa8);
        return iVar1;
      }
      goto LAB_001205cb;
    }
  }
  psStack_90 = (secp256k1_fe *)0x1205cb;
  secp256k1_ge_x_frac_on_curve_var_cold_3();
LAB_001205cb:
  psStack_90 = (secp256k1_fe *)secp256k1_gej_eq_ge_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_a0 = xd;
  psStack_98 = xn;
  psStack_90 = r;
  secp256k1_gej_verify(a_00);
  secp256k1_ge_verify(a);
  secp256k1_gej_neg(&sStack_138,a_00);
  secp256k1_gej_add_ge_var(&sStack_138,&sStack_138,a,(secp256k1_fe *)0x0);
  secp256k1_gej_verify(&sStack_138);
  return sStack_138.infinity;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}